

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# affinity.cpp
# Opt level: O1

int set_thread_affinity(native_handle_type thread,uint *cpuid)

{
  uint uVar1;
  int iVar2;
  cpu_set_t cs;
  cpu_set_t local_88;
  
  local_88.__bits[0xe] = 0;
  local_88.__bits[0xf] = 0;
  local_88.__bits[0xc] = 0;
  local_88.__bits[0xd] = 0;
  local_88.__bits[10] = 0;
  local_88.__bits[0xb] = 0;
  local_88.__bits[8] = 0;
  local_88.__bits[9] = 0;
  local_88.__bits[6] = 0;
  local_88.__bits[7] = 0;
  local_88.__bits[4] = 0;
  local_88.__bits[5] = 0;
  local_88.__bits[2] = 0;
  local_88.__bits[3] = 0;
  local_88.__bits[0] = 0;
  local_88.__bits[1] = 0;
  uVar1 = *cpuid;
  if (uVar1 < 0x400) {
    local_88.__bits[uVar1 >> 6] = local_88.__bits[uVar1 >> 6] | 1L << ((byte)uVar1 & 0x3f);
  }
  iVar2 = pthread_setaffinity_np(thread,0x80,&local_88);
  return iVar2;
}

Assistant:

int
set_thread_affinity(std::thread::native_handle_type thread,
        const unsigned &cpuid)
{
    int rc = -1;
#ifdef __APPLE__
    thread_port_t mach_thread;
    thread_affinity_policy_data_t policy = { static_cast<integer_t>(cpuid) };
    mach_thread = pthread_mach_thread_np(thread);
    rc = thread_policy_set(mach_thread, THREAD_AFFINITY_POLICY,
            (thread_policy_t)&policy, 1);
#elif defined(_WIN32) || defined(__CYGWIN__)
    rc = 0;
#else
    cpu_set_t cs;
    CPU_ZERO(&cs);
    CPU_SET(cpuid, &cs);
    rc = pthread_setaffinity_np(thread, sizeof(cpu_set_t), &cs);
#endif
    return rc;
}